

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

word Dau_Dsd6TruthCompose_rec(word Func,word *pFanins,int nVars)

{
  int iVar;
  int iVar1;
  word wVar2;
  word wVar3;
  ulong local_40;
  word t1;
  word t0;
  int nVars_local;
  word *pFanins_local;
  word Func_local;
  
  if (Func == 0) {
    Func_local = 0;
  }
  else if (Func == 0xffffffffffffffff) {
    Func_local = 0xffffffffffffffff;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                    ,0x155,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
    }
    iVar = nVars + -1;
    if (iVar == 0) {
      if ((Func != s_Truths6[0]) && (Func != s_Truths6Neg[0])) {
        __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x158,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
      }
      if (Func == s_Truths6[0]) {
        local_40 = *pFanins;
      }
      else {
        local_40 = *pFanins ^ 0xffffffffffffffff;
      }
      Func_local = local_40;
    }
    else {
      iVar1 = Abc_Tt6HasVar(Func,iVar);
      if (iVar1 == 0) {
        Func_local = Dau_Dsd6TruthCompose_rec(Func,pFanins,iVar);
      }
      else {
        wVar2 = Abc_Tt6Cofactor0(Func,iVar);
        wVar2 = Dau_Dsd6TruthCompose_rec(wVar2,pFanins,iVar);
        wVar3 = Abc_Tt6Cofactor1(Func,iVar);
        wVar3 = Dau_Dsd6TruthCompose_rec(wVar3,pFanins,iVar);
        Func_local = (pFanins[iVar] ^ 0xffffffffffffffff) & wVar2 | pFanins[iVar] & wVar3;
      }
    }
  }
  return Func_local;
}

Assistant:

word Dau_Dsd6TruthCompose_rec( word Func, word * pFanins, int nVars )
{
    word t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return ~(word)0;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return (Func == s_Truths6[0]) ? pFanins[0] : ~pFanins[0];
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_Dsd6TruthCompose_rec( Func, pFanins, nVars );
    t0 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    return (~pFanins[nVars] & t0) | (pFanins[nVars] & t1);
}